

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O2

gbstatus_e ppu_init(gb_ppu_t *ppu,gb *gb)

{
  uint __line;
  uint8_t *puVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (ppu == (gb_ppu_t *)0x0) {
    pcVar2 = "ppu != NULL";
    __line = 0x60;
  }
  else {
    if (gb != (gb *)0x0) {
      ppu->gb = gb;
      puVar1 = (uint8_t *)calloc(0x2000,1);
      ppu->vram = puVar1;
      if (puVar1 == (uint8_t *)0x0) {
        builtin_strncpy(gbstatus_str + 0x10,"te memory",10);
        builtin_strncpy(gbstatus_str,"unable to alloca",0x10);
      }
      else {
        puVar1 = (uint8_t *)calloc(0xa0,1);
        ppu->oam = puVar1;
        if (puVar1 == (uint8_t *)0x0) {
          builtin_strncpy(gbstatus_str + 0x10,"te memory",10);
          builtin_strncpy(gbstatus_str,"unable to alloca",0x10);
        }
        else {
          pcVar2 = (char *)calloc(0x5a00,1);
          ppu->framebuffer = pcVar2;
          if (pcVar2 == (char *)0x0) {
            builtin_strncpy(gbstatus_str + 0x10,"te memory",10);
            builtin_strncpy(gbstatus_str,"unable to alloca",0x10);
          }
          else {
            pcVar3 = (char *)calloc(0xa0,1);
            ppu->bg_scanline_buffer = pcVar3;
            if (pcVar3 != (char *)0x0) {
              ppu_reset(ppu);
              return GBSTATUS_OK;
            }
            builtin_strncpy(gbstatus_str + 0x10,"te memory",10);
            builtin_strncpy(gbstatus_str,"unable to alloca",0x10);
            free(pcVar2);
          }
          free(ppu->oam);
        }
        free(ppu->vram);
      }
      return GBSTATUS_BAD_ALLOC;
    }
    pcVar2 = "gb != NULL";
    __line = 0x61;
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/ppu.c"
                ,__line,"gbstatus_e ppu_init(gb_ppu_t *, struct gb *)");
}

Assistant:

gbstatus_e ppu_init(gb_ppu_t *ppu, struct gb *gb)
{
    gbstatus_e status = GBSTATUS_OK;

    assert(ppu != NULL);
    assert(gb != NULL);

    ppu->gb = gb;

    ppu->vram = calloc(VRAM_SIZE, sizeof(uint8_t));
    if (ppu->vram == NULL)
    {
        GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
        goto error_handler0;
    }

    ppu->oam = calloc(OAM_SIZE, sizeof(uint8_t));
    if (ppu->oam == NULL)
    {
        GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
        goto error_handler1;
    }

    ppu->framebuffer = calloc(GB_SCREEN_WIDTH * GB_SCREEN_HEIGHT, sizeof(char));
    if (ppu->framebuffer == NULL)
    {
        GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
        goto error_handler2;
    }

    ppu->bg_scanline_buffer = calloc(GB_SCREEN_WIDTH, sizeof(char));
    if (ppu->bg_scanline_buffer == NULL)
    {
        GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
        goto error_handler3;
    }

    ppu_reset(ppu);
    return GBSTATUS_OK;

error_handler3:
    free(ppu->framebuffer);

error_handler2:
    free(ppu->oam);

error_handler1:
    free(ppu->vram);

error_handler0:
    return status;
}